

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O3

void __thiscall avro::ArraySkipper::parse(ArraySkipper *this,Reader *reader,uint8_t *address)

{
  element_type *peVar1;
  uint64_t input;
  int64_t iVar2;
  int64_t size;
  int64_t iVar3;
  
  do {
    input = ReaderImpl<avro::NullValidator>::readVarInt(reader);
    iVar2 = decodeZigzag64(input);
    iVar3 = iVar2;
    if (0 < iVar2) {
      do {
        peVar1 = (this->resolver_).px;
        (**peVar1->_vptr_Resolver)(peVar1,reader,address);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  } while (iVar2 != 0);
  return;
}

Assistant:

virtual void parse(Reader &reader, uint8_t *address) const
    {
        DEBUG_OUT("Skipping array");

        int64_t size = 0;
        do {
            size = reader.readArrayBlockSize();
            for(int64_t i = 0; i < size; ++i) {
                resolver_->parse(reader, address);
            }
        } while (size != 0);
    }